

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan12Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan12Features *features)

{
  bool bVar1;
  reference this_00;
  GenericFeaturesPNextNode local_858;
  GenericFeaturesPNextNode local_448;
  reference local_38;
  GenericFeaturesPNextNode *node;
  iterator __end3;
  iterator __begin3;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range3;
  VkPhysicalDeviceVulkan12Features *features_local;
  GenericFeatureChain *this_local;
  
  __end3 = std::
           vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ::begin(&this->nodes);
  node = (GenericFeaturesPNextNode *)
         std::
         vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
         ::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                *)&node);
    if (!bVar1) {
      GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan12Features>
                (&local_858,features);
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::push_back(&this->nodes,&local_858);
      return;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
              ::operator*(&__end3);
    local_38 = this_00;
    if (features->sType == this_00->sType) break;
    __gnu_cxx::
    __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
    ::operator++(&__end3);
  }
  GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan12Features>
            (&local_448,features);
  GenericFeaturesPNextNode::combine(this_00,&local_448);
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }